

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::PushClipRect
          (ImDrawList *this,ImVec2 cr_min,ImVec2 cr_max,bool intersect_with_current_clip_rect)

{
  ImVec4 *pIVar1;
  long lVar2;
  undefined7 in_register_00000031;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImVec2 local_18;
  float local_10;
  float local_c;
  
  fVar4 = cr_min.y;
  fVar5 = cr_max.x;
  fVar6 = cr_max.y;
  fVar7 = fVar6;
  local_18 = cr_min;
  if (((int)CONCAT71(in_register_00000031,intersect_with_current_clip_rect) != 0) &&
     (lVar2 = (long)(this->_ClipRectStack).Size, lVar2 != 0)) {
    pIVar1 = (this->_ClipRectStack).Data;
    fVar7 = pIVar1[lVar2 + -1].x;
    fVar8 = pIVar1[lVar2 + -1].y;
    if (cr_min.x < fVar7) {
      local_18.y = fVar4;
      local_18.x = fVar7;
      cr_min.y = 0.0;
      cr_min.x = fVar7;
    }
    if (fVar4 < fVar8) {
      local_18.y = fVar8;
      fVar4 = fVar8;
    }
    fVar8 = pIVar1[lVar2 + -1].z;
    if (fVar5 <= pIVar1[lVar2 + -1].z) {
      fVar8 = fVar5;
    }
    fVar7 = pIVar1[lVar2 + -1].w;
    fVar5 = fVar8;
    if (fVar6 <= pIVar1[lVar2 + -1].w) {
      fVar7 = fVar6;
    }
  }
  uVar3 = -(uint)(fVar5 <= cr_min.x);
  local_10 = (float)(~uVar3 & (uint)fVar5 | (uint)cr_min.x & uVar3);
  local_c = (float)(~-(uint)(fVar7 <= fVar4) & (uint)fVar7 | (uint)fVar4 & -(uint)(fVar7 <= fVar4));
  ImVector<ImVec4>::push_back(&this->_ClipRectStack,(value_type *)&local_18);
  UpdateClipRect(this);
  return;
}

Assistant:

void ImDrawList::PushClipRect(ImVec2 cr_min, ImVec2 cr_max, bool intersect_with_current_clip_rect)
{
    ImVec4 cr(cr_min.x, cr_min.y, cr_max.x, cr_max.y);
    if (intersect_with_current_clip_rect && _ClipRectStack.Size)
    {
        ImVec4 current = _ClipRectStack.Data[_ClipRectStack.Size-1];
        if (cr.x < current.x) cr.x = current.x;
        if (cr.y < current.y) cr.y = current.y;
        if (cr.z > current.z) cr.z = current.z;
        if (cr.w > current.w) cr.w = current.w;
    }
    cr.z = ImMax(cr.x, cr.z);
    cr.w = ImMax(cr.y, cr.w);

    _ClipRectStack.push_back(cr);
    UpdateClipRect();
}